

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

int __thiscall QToolBarAreaLayout::remove(QToolBarAreaLayout *this,char *__filename)

{
  bool bVar1;
  int extraout_EAX;
  qsizetype qVar2;
  reference pQVar3;
  reference pQVar4;
  undefined7 extraout_var;
  QToolBarAreaLayout *pQVar5;
  int k;
  QToolBarAreaLayoutLine *line;
  int j;
  QToolBarAreaLayoutInfo *dock;
  int i;
  qsizetype in_stack_ffffffffffffffa8;
  QList<QToolBarAreaLayoutLine> *in_stack_ffffffffffffffb0;
  int local_34;
  int local_24;
  uint local_14;
  
  local_14 = 0;
  pQVar5 = this;
  do {
    if (3 < (int)local_14) {
      return (int)pQVar5;
    }
    for (local_24 = 0;
        qVar2 = QList<QToolBarAreaLayoutLine>::size(&this->docks[(int)local_14].lines),
        local_24 < qVar2; local_24 = local_24 + 1) {
      pQVar3 = QList<QToolBarAreaLayoutLine>::operator[]
                         (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      local_34 = 0;
      while( true ) {
        in_stack_ffffffffffffffb0 = (QList<QToolBarAreaLayoutLine> *)(long)local_34;
        qVar2 = QList<QToolBarAreaLayoutItem>::size(&pQVar3->toolBarItems);
        if (qVar2 <= (long)in_stack_ffffffffffffffb0) break;
        pQVar4 = QList<QToolBarAreaLayoutItem>::operator[]
                           ((QList<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffffb0,
                            in_stack_ffffffffffffffa8);
        if (pQVar4->widgetItem == (QLayoutItem *)__filename) {
          QList<QToolBarAreaLayoutItem>::removeAt
                    ((QList<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffffb0,
                     in_stack_ffffffffffffffa8);
          bVar1 = QList<QToolBarAreaLayoutItem>::isEmpty((QList<QToolBarAreaLayoutItem> *)0x6f4c33);
          if (!bVar1) {
            return (int)CONCAT71(extraout_var,bVar1);
          }
          QList<QToolBarAreaLayoutLine>::removeAt
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
          return extraout_EAX;
        }
        local_34 = local_34 + 1;
      }
    }
    local_14 = local_14 + 1;
    pQVar5 = (QToolBarAreaLayout *)(ulong)local_14;
  } while( true );
}

Assistant:

void QToolBarAreaLayout::remove(QLayoutItem *item)
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            QToolBarAreaLayoutLine &line = dock.lines[j];

            for (int k = 0; k < line.toolBarItems.size(); k++) {
                if (line.toolBarItems[k].widgetItem == item) {
                    line.toolBarItems.removeAt(k);
                    if (line.toolBarItems.isEmpty())
                        dock.lines.removeAt(j);
                    return;
                }
            }
        }
    }
}